

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_conn.c
# Opt level: O0

int proxy_conn_start(proxy_conn_handle *pc)

{
  void *pvVar1;
  int local_1c;
  int ret;
  proxy_conn_priv *priv;
  proxy_conn_handle *pc_local;
  
  pvVar1 = pc->priv;
  mutex_lock_shared((mutex_handle *)((long)pvVar1 + 0x68));
  local_1c = worker_start((worker_handle *)((long)pvVar1 + 0x78));
  if ((-1 < local_1c) &&
     (local_1c = worker_start((worker_handle *)((long)pvVar1 + 0x98)), -1 < local_1c)) {
    local_1c = worker_start((worker_handle *)((long)pvVar1 + 0xb8));
  }
  mutex_unlock_shared((mutex_handle *)((long)pvVar1 + 0x68));
  return local_1c;
}

Assistant:

int proxy_conn_start(struct proxy_conn_handle *pc)
{
	struct proxy_conn_priv *priv = pc->priv;
	int ret;

	mutex_lock_shared(&priv->mutex_client);

	ret = worker_start(&priv->worker_control);
	if (ret < 0)
		goto proxy_conn_start_exit;

	ret = worker_start(&priv->worker_data);
	if (ret < 0)
		goto proxy_conn_start_exit;

	ret = worker_start(&priv->worker_tcp);
	if (ret < 0)
		goto proxy_conn_start_exit;

proxy_conn_start_exit:
	mutex_unlock_shared(&priv->mutex_client);

	return ret;
}